

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O1

RefToken __thiscall antlr::CharScanner::makeToken(CharScanner *this,int t)

{
  _func_int *p_Var1;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  long lVar2;
  
  lVar2 = CONCAT44(in_register_00000034,t);
  (**(code **)(lVar2 + 0x30))();
  p_Var1 = *(this->super_TokenStream)._vptr_TokenStream;
  (**(code **)(*(long *)p_Var1 + 0x50))(p_Var1,in_EDX);
  p_Var1 = *(this->super_TokenStream)._vptr_TokenStream;
  (**(code **)(*(long *)p_Var1 + 0x38))(p_Var1,*(undefined4 *)(**(long **)(lVar2 + 0x78) + 0x10));
  p_Var1 = *(this->super_TokenStream)._vptr_TokenStream;
  (**(code **)(*(long *)p_Var1 + 0x40))(p_Var1,*(undefined4 *)(**(long **)(lVar2 + 0x78) + 0x14));
  return (RefToken)(TokenRef *)this;
}

Assistant:

virtual RefToken makeToken(int t)
	{
		RefToken tok = tokenFactory();
		tok->setType(t);
		tok->setColumn(inputState->tokenStartColumn);
		tok->setLine(inputState->tokenStartLine);
		return tok;
	}